

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

string * __thiscall options::help_abi_cxx11_(options *this,char *prog)

{
  undefined1 *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_d9 [33];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  *in_RSI = 0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_d9 + 1),"Density of state of square lattice Ising model\n",
             (allocator *)__lhs);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  return in_RDI;
}

Assistant:

std::string help(char *prog) {
    valid = false;
    return std::string("Density of state of square lattice Ising model\n") +
      "Usage: " + prog + " L\n" +
      "       " + prog + " Lx Ly\n";
  }